

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddCof0(Abc_ZddMan *p,int a,int Var)

{
  uint uVar1;
  int False;
  int True;
  Abc_ZddObj *pAVar2;
  
  False = a;
  if (1 < a) {
    pAVar2 = p->pObjs;
    if (((int)(*(uint *)(pAVar2 + (uint)a) & 0x7fffffff) <= Var) &&
       (False = Abc_ZddCacheLookup(p,a,Var,7), False < 0)) {
      pAVar2 = pAVar2 + (uint)a;
      uVar1 = *(uint *)pAVar2;
      False = Abc_ZddCof0(p,pAVar2->False,Var);
      if ((uVar1 & 0x7fffffff) < (uint)Var) {
        True = Abc_ZddCof0(p,pAVar2->True,Var);
        False = Abc_ZddUniqueCreate(p,*(uint *)pAVar2 & 0x7fffffff,True,False);
      }
      Abc_ZddCacheInsert(p,a,Var,7,False);
    }
  }
  return False;
}

Assistant:

int Abc_ZddCof0( Abc_ZddMan * p, int a, int Var )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    if ( a < 2 ) return a;
    A = Abc_ZddNode( p, a );
    if ( (int)A->Var > Var )
        return a;
    if ( (r = Abc_ZddCacheLookup(p, a, Var, ABC_ZDD_OPER_COF0)) >= 0 )
        return r;
    if ( (int)A->Var < Var )
        r0 = Abc_ZddCof0( p, A->False, Var ),
        r1 = Abc_ZddCof0( p, A->True, Var ),
        r  = Abc_ZddUniqueCreate( p, A->Var, r1, r0 );
    else
        r = Abc_ZddCof0( p, A->False, Var );
    return Abc_ZddCacheInsert( p, a, Var, ABC_ZDD_OPER_COF0, r );
}